

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O2

void __thiscall IfStatement::evaluate(IfStatement *this,SymTab *symTab)

{
  ExprNode *pEVar1;
  IfStatement *pIVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pEVar1 = this->_cond;
  if (pEVar1 != (ExprNode *)0x0) {
    iVar3 = (*pEVar1->_vptr_ExprNode[1])(pEVar1,symTab);
    if (*(double *)(CONCAT44(extraout_var,iVar3) + 8) <= 0.0) {
      pIVar2 = this->_elif;
      if (pIVar2 != (IfStatement *)0x0) {
        (*(pIVar2->super_Statement)._vptr_Statement[1])(pIVar2,symTab);
        return;
      }
      return;
    }
  }
  Statements::evaluate(this->_stmts,symTab);
  return;
}

Assistant:

void IfStatement::evaluate(SymTab &symTab) {
    if((_cond == nullptr) || (_cond->evaluate(symTab)->_number > 0)) _stmts->evaluate(symTab);
    else if(_elif != nullptr) _elif->evaluate(symTab);
//    std::vector<std::pair<ExprNode *, Statements *>> testsAndSuites = getTestsAndSuites();
//    int i = 0;
//    bool elseStatement = true;
//    while(i < testsAndSuites.size()){
//        if (testsAndSuites[i].first == nullptr) {i++; continue;}
//        if(testsAndSuites[i].first->evaluate(symTab)->getNumber() != 0) {
//            testsAndSuites[i].second->evaluate(symTab);
//            elseStatement = false;
//        }
//        i++;
//    }
//    if (elseStatement)
//        testsAndSuites[i-1].second->evaluate(symTab);
}